

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevicewindow_p.h
# Opt level: O0

void __thiscall QPaintDeviceWindowPrivate::markWindowAsDirty(QPaintDeviceWindowPrivate *this)

{
  QRect *this_00;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QPaintDeviceWindow *q;
  QRegion *other;
  QPoint *in_stack_ffffffffffffffa0;
  QRegion *this_01;
  QPoint *in_stack_ffffffffffffffb8;
  QRegion *this_02;
  QRegion local_28 [8];
  QRegion local_20 [16];
  QRegion local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)q_func((QPaintDeviceWindowPrivate *)in_RDI);
  other = local_28;
  QPoint::QPoint(in_stack_ffffffffffffffa0,(int)((ulong)other >> 0x20),(int)other);
  (**(code **)(*(long *)this_00 + 0x70))();
  this_01 = local_20;
  QRect::QRect(this_00,in_stack_ffffffffffffffb8,in_RDI);
  this_02 = local_10;
  QRegion::QRegion(this_02,this_01,0);
  QRegion::operator=(this_01,other);
  QRegion::~QRegion(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void markWindowAsDirty()
    {
        Q_Q(QPaintDeviceWindow);
        dirtyRegion = QRect(QPoint(0, 0), q->size());
    }